

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# security_materials.cpp
# Opt level: O0

Error * ot::commissioner::security_material::Init
                  (Error *__return_storage_ptr__,Config *aDefaultConfig)

{
  ulong uVar1;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar3;
  string_view fmt;
  format_args args;
  char *local_1a8;
  string local_190;
  anon_class_1_0_00000001 local_16a;
  v10 local_169;
  v10 *local_168;
  size_t local_160;
  string local_158;
  allocator local_131;
  string local_130;
  allocator local_109;
  string local_108;
  string local_d8 [8];
  string root;
  Config *aDefaultConfig_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_a8 [2];
  undefined1 local_98 [16];
  v10 *local_88;
  ulong local_80;
  v10 *local_78;
  size_t sStack_70;
  string *local_68;
  v10 *local_60;
  v10 **local_58;
  v10 **local_50;
  v10 *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  root.field_2._8_8_ = aDefaultConfig;
  std::__cxx11::string::string(local_d8,(string *)&aDefaultConfig->mThreadSMRoot);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    pcVar2 = getenv("THREAD_SM_ROOT");
    if (pcVar2 == (char *)0x0) {
      local_1a8 = "";
    }
    else {
      local_1a8 = getenv("THREAD_SM_ROOT");
    }
    std::__cxx11::string::operator=(local_d8,local_1a8);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) != 0) {
      if ((gVerbose & 1) == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_130,"security-materials",&local_131);
        Init::anon_class_1_0_00000001::operator()(&local_16a);
        local_58 = &local_168;
        local_60 = &local_169;
        bVar3 = ::fmt::v10::operator()(local_60);
        local_160 = bVar3.size_;
        local_168 = (v10 *)bVar3.data_;
        ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
        local_68 = &local_158;
        local_78 = local_168;
        sStack_70 = local_160;
        local_50 = &local_78;
        local_88 = local_168;
        local_80 = local_160;
        local_48 = local_88;
        sStack_40 = local_80;
        local_a8[0] = ::fmt::v10::
                      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
        local_30 = local_98;
        local_38 = local_a8;
        local_18 = 0;
        fmt.size_ = 0;
        fmt.data_ = (char *)local_80;
        args.field_1.values_ = in_R9.values_;
        args.desc_ = (unsigned_long_long)local_38;
        local_28 = local_38;
        local_20 = local_38;
        local_10 = local_30;
        ::fmt::v10::vformat_abi_cxx11_(&local_158,local_88,fmt,args);
        Log(kDebug,&local_130,&local_158);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&local_130);
        std::allocator<char>::~allocator((allocator<char> *)&local_131);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_108,"ThreadSMRoot value is not available",&local_109);
        Console::Write(&local_108,kYellow);
        std::__cxx11::string::~string((string *)&local_108);
        std::allocator<char>::~allocator((allocator<char> *)&local_109);
      }
    }
  }
  std::__cxx11::string::string((string *)&local_190,local_d8);
  SMRoot::Set((SMRoot *)smRoot,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  Error::Error(__return_storage_ptr__);
  std::__cxx11::string::~string(local_d8);
  return __return_storage_ptr__;
}

Assistant:

Error Init(const Config &aDefaultConfig)
{
    std::string root = aDefaultConfig.mThreadSMRoot;

    if (root.empty())
    {
        root = SafeStr(getenv("THREAD_SM_ROOT"));
        if (root.empty())
        {
            if (gVerbose)
            {
                Console::Write(SM_ERROR_MESSAGE_NO_ROOT_AVAILABLE, Console::Color::kYellow);
            }
            else
            {
                LOG_DEBUG(LOG_REGION_SECURITY_MATERIALS, SM_ERROR_MESSAGE_NO_ROOT_AVAILABLE);
            }
        }
    }
    smRoot.Set(root);
    return ERROR_NONE;
}